

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::OptionsExtract::process
          (OptionsExtract *this,Options *param_2,ParseResult *args,Reporter *report)

{
  bool bVar1;
  __optional_eq_t<ktx::SelectorRange,_ktx::All_t> _Var2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool *pbVar5;
  OptionValue *this_00;
  undefined8 in_RCX;
  ParseResult *in_RDX;
  string *in_RDI;
  bool isMultiOutputFragmentURI;
  exception *e;
  optional<ktx::SelectorRange> depth_;
  optional<ktx::SelectorRange> face;
  optional<ktx::SelectorRange> layer;
  optional<ktx::SelectorRange> level;
  anon_class_16_2_501fead0 parseSelector;
  FragmentURI *in_stack_fffffffffffffb18;
  RangeIndex index;
  FragmentURI *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  undefined1 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb31;
  undefined1 in_stack_fffffffffffffb32;
  undefined1 in_stack_fffffffffffffb33;
  undefined1 in_stack_fffffffffffffb34;
  undefined1 in_stack_fffffffffffffb35;
  undefined1 in_stack_fffffffffffffb36;
  undefined1 in_stack_fffffffffffffb37;
  optional<ktx::SelectorRange> *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  ParseResult *in_stack_fffffffffffffb48;
  ParseResult *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  OptionValue *in_stack_fffffffffffffb70;
  char (*in_stack_fffffffffffffb80) [63];
  char (*args_00) [57];
  Reporter *in_stack_fffffffffffffb88;
  Reporter *this_01;
  bool *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  string *name;
  anon_class_16_2_501fead0 *in_stack_fffffffffffffbf8;
  anon_class_16_2_501fead0 *this_02;
  undefined1 local_308 [79];
  undefined1 local_2b9;
  undefined1 local_2a1 [33];
  undefined1 local_280 [16];
  undefined1 local_221 [40];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [49];
  string_view in_stack_fffffffffffffe88;
  allocator<char> local_161;
  string local_160 [71];
  allocator<char> local_119;
  string local_118 [71];
  allocator<char> local_d1;
  string local_d0 [64];
  ParseResult *local_90;
  undefined8 local_88;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined8 local_20;
  ParseResult *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  sVar3 = cxxopts::ParseResult::count(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar3 == 0) {
    Reporter::fatal_usage<char_const(&)[39]>
              (in_stack_fffffffffffffb88,(char (*) [39])in_stack_fffffffffffffb80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    cxxopts::ParseResult::operator[](in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffb70);
    std::__cxx11::string::operator=(in_RDI,(string *)pbVar4);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  local_90 = local_18;
  local_88 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  process::anon_class_16_2_501fead0::operator()
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  process::anon_class_16_2_501fead0::operator()
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  process::anon_class_16_2_501fead0::operator()
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  this_02 = (anon_class_16_2_501fead0 *)local_1a9;
  name = (string *)kDepth;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  process::anon_class_16_2_501fead0::operator()(this_02,name,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
  pbVar5 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffb70);
  in_RDI[0x86] = (string)(*pbVar5 & 1);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
  pbVar5 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffb70);
  in_RDI[0x85] = (string)(*pbVar5 & 1);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  if (((byte)in_RDI[0x85] & 1) != 0) {
    bVar1 = std::optional::operator_cast_to_bool((optional<ktx::SelectorRange> *)0x26b571);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[56]>
                (in_stack_fffffffffffffb88,(char (*) [56])in_stack_fffffffffffffb80);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<ktx::SelectorRange> *)0x26b771);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[56]>
                (in_stack_fffffffffffffb88,(char (*) [56])in_stack_fffffffffffffb80);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<ktx::SelectorRange> *)0x26b79c);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[55]>
                (in_stack_fffffffffffffb88,(char (*) [55])in_stack_fffffffffffffb80);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<ktx::SelectorRange> *)0x26b7c7);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[56]>
                (in_stack_fffffffffffffb88,(char (*) [56])in_stack_fffffffffffffb80);
    }
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))),
               (All_t *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))),
               (All_t *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))),
               (All_t *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))),
               (All_t *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
  }
  if ((((byte)in_RDI[0x85] & 1) != 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    Reporter::fatal_usage<char_const(&)[57]>
              (in_stack_fffffffffffffb88,(char (*) [57])in_stack_fffffffffffffb80);
  }
  _Var2 = std::operator==((optional<ktx::SelectorRange> *)in_stack_fffffffffffffb20,
                          (All_t *)in_stack_fffffffffffffb18);
  if ((_Var2) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    Reporter::fatal_usage<char_const(&)[63]>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  }
  _Var2 = std::operator==((optional<ktx::SelectorRange> *)in_stack_fffffffffffffb20,
                          (All_t *)in_stack_fffffffffffffb18);
  if ((_Var2) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    Reporter::fatal_usage<char_const(&)[63]>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  }
  _Var2 = std::operator==((optional<ktx::SelectorRange> *)in_stack_fffffffffffffb20,
                          (All_t *)in_stack_fffffffffffffb18);
  if ((_Var2) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    Reporter::fatal_usage<char_const(&)[62]>
              (in_stack_fffffffffffffb88,(char (*) [62])in_stack_fffffffffffffb80);
  }
  _Var2 = std::operator==((optional<ktx::SelectorRange> *)in_stack_fffffffffffffb20,
                          (All_t *)in_stack_fffffffffffffb18);
  if ((_Var2) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    Reporter::fatal_usage<char_const(&)[63]>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  }
  this_01 = (Reporter *)local_221;
  args_00 = (char (*) [57])kUri;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             (allocator<char> *)in_stack_fffffffffffffb50);
  this_00 = cxxopts::ParseResult::operator[]
                      (in_stack_fffffffffffffb50,(string *)in_stack_fffffffffffffb48);
  sVar3 = cxxopts::OptionValue::count(this_00);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  if (sVar3 == 0) {
    SelectorRange::SelectorRange
              (&in_stack_fffffffffffffb20->mip,
               (RangeIndex)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (in_stack_fffffffffffffb38,
               (SelectorRange *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))));
    in_stack_fffffffffffffb20 = (FragmentURI *)(local_308 + 0x30);
    SelectorRange::operator=
              ((SelectorRange *)in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->mip);
    index = (RangeIndex)((ulong)in_stack_fffffffffffffb18 >> 0x20);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bf1f);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bf2c);
    SelectorRange::SelectorRange(&in_stack_fffffffffffffb20->mip,index);
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (in_stack_fffffffffffffb38,
               (SelectorRange *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))));
    in_stack_fffffffffffffb18 = (FragmentURI *)local_308;
    SelectorRange::operator=
              (&in_stack_fffffffffffffb20->mip,(SelectorRange *)in_stack_fffffffffffffb18);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bf82);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bf8f);
    SelectorRange::SelectorRange
              (&in_stack_fffffffffffffb20->mip,
               (RangeIndex)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
              (in_stack_fffffffffffffb38,
               (SelectorRange *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,
                                 CONCAT15(in_stack_fffffffffffffb35,
                                          CONCAT14(in_stack_fffffffffffffb34,
                                                   CONCAT13(in_stack_fffffffffffffb33,
                                                            CONCAT12(in_stack_fffffffffffffb32,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))));
    SelectorRange::operator=(&in_stack_fffffffffffffb20->mip,&in_stack_fffffffffffffb18->mip);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bfe9);
    SelectorRange::~SelectorRange((SelectorRange *)0x26bff6);
    goto LAB_0026c06a;
  }
  in_RDI[0x84] = (string)0x1;
  if (((byte)in_RDI[0x85] & 1) != 0) {
    Reporter::fatal_usage<char_const(&)[54]>(this_01,(char (*) [54])args_00);
  }
  if (((byte)in_RDI[0x80] & 1) != 0) {
    Reporter::fatal_usage<char_const(&)[56]>(this_01,(char (*) [56])args_00);
  }
  if (((byte)in_RDI[0x81] & 1) != 0) {
    Reporter::fatal_usage<char_const(&)[56]>(this_01,(char (*) [56])args_00);
  }
  if (((byte)in_RDI[0x82] & 1) != 0) {
    Reporter::fatal_usage<char_const(&)[55]>(this_01,(char (*) [55])args_00);
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a1;
  __s = kUri;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar4,__s,(allocator<char> *)local_18);
  cxxopts::ParseResult::operator[](local_18,(string *)in_stack_fffffffffffffb48);
  pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
  local_280 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar4);
  parseFragmentURI(in_stack_fffffffffffffe88);
  FragmentURI::operator=(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  FragmentURI::~FragmentURI(in_stack_fffffffffffffb20);
  std::__cxx11::string::~string((string *)(local_2a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2a1);
  in_stack_fffffffffffffb37 = SelectorRange::is_undefined((SelectorRange *)0x26bd79);
  if ((bool)in_stack_fffffffffffffb37) {
LAB_0026bdb5:
    in_stack_fffffffffffffb34 = SelectorRange::is_undefined((SelectorRange *)0x26bdc6);
    if (!(bool)in_stack_fffffffffffffb34) {
      in_stack_fffffffffffffb33 = SelectorRange::is_multi((SelectorRange *)0x26bde7);
      in_stack_fffffffffffffb35 = true;
      if ((bool)in_stack_fffffffffffffb33) goto LAB_0026be4f;
    }
    in_stack_fffffffffffffb32 = SelectorRange::is_undefined((SelectorRange *)0x26be0f);
    in_stack_fffffffffffffb31 = false;
    in_stack_fffffffffffffb35 = false;
    if (!(bool)in_stack_fffffffffffffb32) {
      in_stack_fffffffffffffb30 = SelectorRange::is_multi((SelectorRange *)0x26be37);
      in_stack_fffffffffffffb31 = in_stack_fffffffffffffb30;
      in_stack_fffffffffffffb35 = in_stack_fffffffffffffb30;
    }
  }
  else {
    in_stack_fffffffffffffb36 = SelectorRange::is_multi((SelectorRange *)0x26bd9a);
    in_stack_fffffffffffffb35 = true;
    if (!(bool)in_stack_fffffffffffffb36) goto LAB_0026bdb5;
  }
LAB_0026be4f:
  local_2b9 = in_stack_fffffffffffffb35;
  if ((bool)in_stack_fffffffffffffb35 != false) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[57]>(this_01,args_00);
    }
  }
LAB_0026c06a:
  SelectorRange::SelectorRange
            (&in_stack_fffffffffffffb20->mip,(RangeIndex)((ulong)in_stack_fffffffffffffb18 >> 0x20))
  ;
  std::optional<ktx::SelectorRange>::value_or<ktx::SelectorRange>
            (in_stack_fffffffffffffb38,
             (SelectorRange *)
             CONCAT17(in_stack_fffffffffffffb37,
                      CONCAT16(in_stack_fffffffffffffb36,
                               CONCAT15(in_stack_fffffffffffffb35,
                                        CONCAT14(in_stack_fffffffffffffb34,
                                                 CONCAT13(in_stack_fffffffffffffb33,
                                                          CONCAT12(in_stack_fffffffffffffb32,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb31,
                                                  in_stack_fffffffffffffb30))))))));
  SelectorRange::operator=(&in_stack_fffffffffffffb20->mip,&in_stack_fffffffffffffb18->mip);
  SelectorRange::~SelectorRange((SelectorRange *)0x26c0c0);
  SelectorRange::~SelectorRange((SelectorRange *)0x26c0cd);
  std::optional<ktx::SelectorRange>::~optional((optional<ktx::SelectorRange> *)0x26c0da);
  std::optional<ktx::SelectorRange>::~optional((optional<ktx::SelectorRange> *)0x26c0e7);
  std::optional<ktx::SelectorRange>::~optional((optional<ktx::SelectorRange> *)0x26c0f4);
  std::optional<ktx::SelectorRange>::~optional((optional<ktx::SelectorRange> *)0x26c101);
  return;
}

Assistant:

void CommandExtract::OptionsExtract::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args.count(kOutput))
        outputPath = args[kOutput].as<std::string>();
    else
        report.fatal_usage("Missing output file or directory path.");

    const auto parseSelector = [&](const std::string& name, bool& found) -> std::optional<SelectorRange> {
        if (!args[name].count())
            return std::nullopt;
        const auto str = to_lower_copy(args[name].as<std::string>());
        try {
            found = true;
            return str == kAll ? SelectorRange(all) : SelectorRange(std::stoi(str));
        } catch (const std::invalid_argument&) {
            report.fatal_usage("Invalid {} value \"{}\". The value must be a either a number or \"all\".", name, str);
        } catch (const std::out_of_range& e) {
            report.fatal_usage("Out of range {} value \"{}\": {}.", name, str, e.what());
        }
        return std::nullopt;
    };

    auto level = parseSelector(kLevel, levelFlagUsed);
    auto layer = parseSelector(kLayer, layerFlagUsed);
    auto face = parseSelector(kFace, faceFlagUsed);
    auto depth_ = parseSelector(kDepth, depthFlagUsed);
    raw = args[kRaw].as<bool>();
    globalAll = args[kAll].as<bool>();

    if (globalAll) {
        if (level)
            report.fatal_usage("Conflicting options: --level cannot be used with --all.");
        if (layer)
            report.fatal_usage("Conflicting options: --layer cannot be used with --all.");
        if (face)
            report.fatal_usage("Conflicting options: --face cannot be used with --all.");
        if (depth_)
            report.fatal_usage("Conflicting options: --depth cannot be used with --all.");

        level = all;
        layer = all;
        face = all;
        depth_ = all;
    }

    if (globalAll && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--all' extract.");
    if (level == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--level all' extract.");
    if (layer == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--layer all' extract.");
    if (face == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--face all' extract.");
    if (depth_ == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--depth all' extract.");

    if (args[kUri].count()) {
        uriFlagUsed = true;

        if (globalAll)
            report.fatal_usage("Conflicting options: --all cannot be used with --uri.");
        if (levelFlagUsed)
            report.fatal_usage("Conflicting options: --level cannot be used with --uri.");
        if (layerFlagUsed)
            report.fatal_usage("Conflicting options: --layer cannot be used with --uri.");
        if (faceFlagUsed)
            report.fatal_usage("Conflicting options: --face cannot be used with --uri.");

        try {
            fragmentURI = parseFragmentURI(args[kUri].as<std::string>());
        } catch (const std::exception& e) {
            report.fatal_usage("Failed to parse Fragment URI: {}", e.what());
        }

        const auto isMultiOutputFragmentURI =
                (!fragmentURI.mip.is_undefined() && fragmentURI.mip.is_multi()) ||
                (!fragmentURI.stratal.is_undefined() && fragmentURI.stratal.is_multi()) ||
                (!fragmentURI.facial.is_undefined() && fragmentURI.facial.is_multi());
        if (isMultiOutputFragmentURI && outputPath == "-")
            report.fatal_usage("stdout cannot be used with multi-output '--uri' extract.");

    } else {
        // Merge every other selection method into the fragmentURI
        fragmentURI.mip = level.value_or(SelectorRange(0));
        fragmentURI.stratal = layer.value_or(SelectorRange(0));
        fragmentURI.facial = face.value_or(SelectorRange(0));
    }

    this->depth = depth_.value_or(SelectorRange(0));
}